

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::updateRwSetting
          (ChainImpl *this,string *name,SettingsUpdate *update_settings_func)

{
  bool bVar1;
  ArgsManager *pAVar2;
  UniValue *__args;
  optional<interfaces::SettingsAction> oVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  *map;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar2 = args(this);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&pAVar2->cs_args,
             "cs_args",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.h"
             ,0x19e,false);
  map = &(pAVar2->m_settings).rw_settings;
  __args = common::
           FindKey<std::map<std::__cxx11::string,UniValue,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,UniValue>>>&,std::__cxx11::string_const&>
                     (map,name);
  if (__args == (mapped_type *)0x0) {
    __args = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             ::operator[](map,name);
  }
  oVar3 = std::function<std::optional<interfaces::SettingsAction>_(UniValue_&)>::operator()
                    (update_settings_func,__args);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if (((ulong)oVar3.super__Optional_base<interfaces::SettingsAction,_true,_true>._M_payload.
              super__Optional_payload_base<interfaces::SettingsAction> >> 0x20 & 1) == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (oVar3.super__Optional_base<interfaces::SettingsAction,_true,_true>._M_payload.
        super__Optional_payload_base<interfaces::SettingsAction>._M_payload != SKIP_WRITE) {
      pAVar2 = args(this);
      bVar1 = ArgsManager::WriteSettingsFile
                        (pAVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)0x0,false);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool updateRwSetting(const std::string& name,
                         const interfaces::SettingsUpdate& update_settings_func) override
    {
        std::optional<interfaces::SettingsAction> action;
        args().LockSettings([&](common::Settings& settings) {
            auto* ptr_value = common::FindKey(settings.rw_settings, name);
            // Create value if it doesn't exist
            auto& value = ptr_value ? *ptr_value : settings.rw_settings[name];
            action = update_settings_func(value);
        });
        if (!action) return false;
        // Now dump value to disk if requested
        return *action == interfaces::SettingsAction::SKIP_WRITE || args().WriteSettingsFile();
    }